

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

void __thiscall CMU462::HalfedgeMesh::splitPolygon(HalfedgeMesh *this,FaceIter f)

{
  size_t *psVar1;
  ulong uVar2;
  FaceIter FVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  *__range1;
  _List_iterator<CMU462::Vertex> *p_Var8;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  vertexes;
  _List_iterator<CMU462::Vertex> *local_88;
  iterator iStack_80;
  _List_iterator<CMU462::Vertex> *local_78;
  _List_node_base *local_70;
  _List_node_base *local_68;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *local_60;
  _List_node_base *local_58;
  _List_iterator<CMU462::Vertex> *local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  uVar2 = 0;
  p_Var7 = f._M_node[0xb]._M_prev;
  do {
    uVar2 = uVar2 + 1;
    p_Var7 = p_Var7[2]._M_next;
  } while (f._M_node[0xb]._M_prev != p_Var7);
  if (3 < uVar2) {
    p_Var7 = f._M_node[0xb]._M_prev;
    local_40 = p_Var7[2]._M_prev;
    p_Var4 = p_Var7;
    do {
      p_Var5 = p_Var4;
      p_Var4 = p_Var5[2]._M_next;
    } while (p_Var7 != p_Var4);
    local_88 = (_List_iterator<CMU462::Vertex> *)0x0;
    iStack_80._M_current = (_List_iterator<CMU462::Vertex> *)0x0;
    local_78 = (_List_iterator<CMU462::Vertex> *)0x0;
    p_Var7 = p_Var7[2]._M_next[2]._M_next;
    do {
      if (iStack_80._M_current == local_78) {
        std::
        vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Vertex>const&>
                  ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
                    *)&local_88,iStack_80,(_List_iterator<CMU462::Vertex> *)&p_Var7[2]._M_prev);
      }
      else {
        (iStack_80._M_current)->_M_node = p_Var7[2]._M_prev;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      p_Var7 = p_Var7[2]._M_next;
    } while (f._M_node[0xb]._M_prev != p_Var7);
    iStack_80._M_current = iStack_80._M_current + -1;
    local_50 = iStack_80._M_current;
    local_48 = f._M_node;
    if (local_88 != iStack_80._M_current) {
      local_60 = &this->edges;
      local_68 = (_List_node_base *)&PTR_centroid_00271dd8;
      local_58 = (_List_node_base *)&PTR_centroid_00271d18;
      p_Var8 = local_88;
      local_70 = p_Var5;
      do {
        p_Var7 = p_Var8->_M_node;
        FVar3 = newFace(this);
        local_38 = p_Var7;
        p_Var4 = (_List_node_base *)operator_new(0x70);
        p_Var7 = local_58;
        p_Var4[1]._M_next = local_68;
        p_Var4[4]._M_next = (_List_node_base *)0x0;
        p_Var4[4]._M_prev = (_List_node_base *)0x0;
        p_Var4[5]._M_next = (_List_node_base *)0x0;
        p_Var4[5]._M_prev = (_List_node_base *)0x0;
        p_Var4[6]._M_next = (_List_node_base *)0x0;
        p_Var4[6]._M_prev = (_List_node_base *)0x0;
        p_Var4[1]._M_prev = (_List_node_base *)0x0;
        p_Var4[2]._M_next = (_List_node_base *)0x0;
        p_Var4[2]._M_prev = (_List_node_base *)0x0;
        p_Var4[3]._M_next = (_List_node_base *)0x0;
        *(undefined1 *)&p_Var4[3]._M_prev = 0;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var5 = (_List_node_base *)operator_new(0x40);
        p_Var5[1]._M_next = p_Var7;
        p_Var5[1]._M_prev = (_List_node_base *)0x0;
        p_Var5[2]._M_next = (_List_node_base *)0x0;
        p_Var5[2]._M_prev = (_List_node_base *)0x0;
        p_Var5[3]._M_next = (_List_node_base *)0x0;
        p_Var5[3]._M_prev = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var6 = (_List_node_base *)operator_new(0x40);
        p_Var6[1]._M_next = p_Var7;
        p_Var6[1]._M_prev = (_List_node_base *)0x0;
        p_Var6[2]._M_next = (_List_node_base *)0x0;
        p_Var6[2]._M_prev = (_List_node_base *)0x0;
        p_Var6[3]._M_next = (_List_node_base *)0x0;
        p_Var6[3]._M_prev = (_List_node_base *)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(this->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var7 = local_48[0xb]._M_prev;
        p_Var5[3]._M_next = p_Var4;
        p_Var6[3]._M_next = p_Var4;
        p_Var4[6]._M_prev = p_Var5;
        p_Var5[1]._M_prev = p_Var6;
        p_Var6[1]._M_prev = p_Var5;
        p_Var5[2]._M_prev = local_38;
        local_38[0xf]._M_prev = p_Var5;
        p_Var6[2]._M_prev = local_40;
        local_40[0xf]._M_prev = p_Var6;
        p_Var5[3]._M_prev = FVar3._M_node;
        FVar3._M_node[0xb]._M_prev = p_Var5;
        p_Var6[3]._M_prev = local_48;
        local_48[0xb]._M_prev = p_Var6;
        p_Var6[2]._M_next = p_Var7[2]._M_next[2]._M_next;
        p_Var7[2]._M_next[2]._M_next = p_Var5;
        p_Var5[2]._M_next = p_Var7;
        local_70[2]._M_next = p_Var6;
        p_Var7[3]._M_prev = FVar3._M_node;
        p_Var7[2]._M_next[3]._M_prev = FVar3._M_node;
        p_Var8 = p_Var8 + 1;
      } while (p_Var8 != local_50);
    }
    if (local_88 != (_List_iterator<CMU462::Vertex> *)0x0) {
      operator_delete(local_88);
    }
  }
  return;
}

Assistant:

void HalfedgeMesh::splitPolygon(FaceIter f) {
	// TODO: (meshedit) 
	// Triangulate a polygonal face
	if (f->degree() < 4) return;

	VertexIter main_vertex = f->halfedge()->vertex();
	HalfedgeIter last_Halfedge = prev_Halfedge(f->halfedge());
	vector<VertexIter> vertexes;

	HalfedgeIter temp = f->halfedge()->next()->next();
	do {
		vertexes.push_back(temp->vertex());
		temp = temp->next();
	} while (temp != f->halfedge());
	vertexes.pop_back();


	for (VertexIter curr_vertex : vertexes) {
		FaceIter new_Face = newFace();
		EdgeIter new_Edge = newEdge();
		HalfedgeIter new_Halfedge1 = newHalfedge();
		HalfedgeIter new_Halfedge2 = newHalfedge();

		HalfedgeIter main_Halfedge = f->halfedge();

		new_Halfedge1->edge() = new_Edge;
		new_Halfedge2->edge() = new_Edge;
		new_Edge->halfedge() = new_Halfedge1;

		new_Halfedge1->twin() = new_Halfedge2;
		new_Halfedge2->twin() = new_Halfedge1;

		new_Halfedge1->vertex() = curr_vertex;
		curr_vertex->halfedge() = new_Halfedge1;
		new_Halfedge2->vertex() = main_vertex;
		main_vertex->halfedge() = new_Halfedge2;

		new_Halfedge1->face() = new_Face;
		new_Face->halfedge() = new_Halfedge1;
		new_Halfedge2->face() = f;
		f->halfedge() = new_Halfedge2;

		new_Halfedge2->next() = main_Halfedge->next()->next();
		main_Halfedge->next()->next() = new_Halfedge1;
		new_Halfedge1->next() = main_Halfedge;
		last_Halfedge->next() = new_Halfedge2;

		main_Halfedge->face() = new_Face;
		main_Halfedge->next()->face() = new_Face;
	}

	//showError("splitPolygon() not implemented.");
}